

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int freeSpace(MemPage *pPage,u16 iStart,u16 iSize)

{
  ulong uVar1;
  uint uVar2;
  u8 *puVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  undefined8 uVar7;
  undefined6 in_register_00000012;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  undefined6 in_register_00000032;
  ushort uVar12;
  ulong uVar13;
  uint uVar14;
  byte bVar15;
  ushort uVar16;
  uint uVar17;
  ulong uVar18;
  
  uVar10 = CONCAT62(in_register_00000032,iStart);
  uVar18 = CONCAT62(in_register_00000012,iSize) & 0xffffffff;
  uVar11 = (uint)uVar10;
  uVar6 = (int)CONCAT62(in_register_00000012,iSize) + uVar11;
  puVar3 = pPage->aData;
  uVar5 = (ulong)pPage->hdrOffset;
  uVar1 = uVar5 + 1;
  uVar4 = uVar1;
  uVar9 = uVar18;
  if ((puVar3[uVar5 + 2] == '\0') && (puVar3[uVar1] == '\0')) {
    uVar12 = 0;
    uVar13 = uVar1;
LAB_0014c13e:
    uVar14 = (uint)(ushort)(*(ushort *)(puVar3 + uVar5 + 5) << 8 |
                           *(ushort *)(puVar3 + uVar5 + 5) >> 8);
    if (uVar14 < uVar11) {
      *(ushort *)(puVar3 + uVar13) = (ushort)uVar10 << 8 | (ushort)uVar10 >> 8;
    }
    else {
      if ((uVar11 < uVar14) || ((uint)uVar1 != (uint)uVar13)) {
        uVar7 = 0xfcac;
        goto LAB_0014c1e9;
      }
      *(ushort *)(puVar3 + uVar1) = uVar12 << 8 | uVar12 >> 8;
      puVar3[uVar5 + 5] = (u8)(uVar6 >> 8);
      puVar3[uVar5 + 6] = (u8)uVar6;
    }
    uVar10 = uVar10 & 0xffff;
    if ((pPage->pBt->btsFlags & 0xc) != 0) {
      memset(puVar3 + uVar10,0,uVar9 & 0xffff);
    }
    puVar3[uVar10] = (u8)(uVar12 >> 8);
    puVar3[uVar10 + 1] = (u8)uVar12;
    puVar3[uVar10 + 2] = (u8)(uVar9 >> 8);
    puVar3[uVar10 + 3] = (u8)uVar9;
    pPage->nFree = pPage->nFree + (short)uVar18;
    iVar8 = 0;
  }
  else {
    do {
      uVar13 = uVar4;
      uVar16 = *(ushort *)(puVar3 + uVar13);
      uVar12 = uVar16 << 8 | uVar16 >> 8;
      uVar17 = (uint)uVar12;
      uVar14 = (uint)uVar13;
      if (iStart <= uVar12) goto LAB_0014bfa9;
      uVar4 = (ulong)uVar12;
    } while (uVar14 + 4 <= uVar17);
    if (uVar12 == 0) {
LAB_0014bfa9:
      uVar2 = pPage->pBt->usableSize;
      if (uVar2 - 4 < uVar17) {
        uVar7 = 0xfc82;
      }
      else if (uVar6 + 3 < uVar17 || uVar12 == 0) {
        bVar15 = 0;
LAB_0014bffe:
        if (((uint)uVar1 < uVar14) &&
           (uVar16 = *(ushort *)(puVar3 + uVar13 + 2) << 8 | *(ushort *)(puVar3 + uVar13 + 2) >> 8,
           uVar11 <= uVar16 + uVar14 + 3)) {
          uVar17 = uVar16 + uVar14;
          if (uVar11 < uVar17) {
            uVar7 = 0xfc9e;
            goto LAB_0014c1e9;
          }
          bVar15 = bVar15 + ((char)iStart - (char)uVar17);
          uVar9 = (ulong)(uVar6 - uVar14);
          uVar10 = uVar13;
        }
        if (bVar15 <= puVar3[uVar5 + 7]) {
          puVar3[uVar5 + 7] = puVar3[uVar5 + 7] - bVar15;
          uVar11 = (uint)uVar10 & 0xffff;
          goto LAB_0014c13e;
        }
        uVar7 = 0xfca4;
      }
      else {
        bVar15 = (char)(uVar16 >> 8) - (char)uVar6;
        if (uVar12 < uVar6) {
          uVar7 = 0xfc8e;
        }
        else {
          uVar6 = (ushort)(*(ushort *)(puVar3 + (ulong)uVar12 + 2) << 8 |
                          *(ushort *)(puVar3 + (ulong)uVar12 + 2) >> 8) + uVar17;
          if (uVar6 <= uVar2) {
            uVar9 = (ulong)(uVar6 - uVar11);
            uVar12 = *(ushort *)(puVar3 + uVar12) << 8 | *(ushort *)(puVar3 + uVar12) >> 8;
            goto LAB_0014bffe;
          }
          uVar7 = 0xfc91;
        }
      }
    }
    else {
      uVar7 = 0xfc7d;
    }
LAB_0014c1e9:
    iVar8 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar7,
                "bf8c1b2b7a5960c282e543b9c293686dccff272512d08865f4600fb58238b4f9");
  }
  return iVar8;
}

Assistant:

static int freeSpace(MemPage *pPage, u16 iStart, u16 iSize){
  u16 iPtr;                             /* Address of ptr to next freeblock */
  u16 iFreeBlk;                         /* Address of the next freeblock */
  u8 hdr;                               /* Page header size.  0 or 100 */
  u8 nFrag = 0;                         /* Reduction in fragmentation */
  u16 iOrigSize = iSize;                /* Original value of iSize */
  u16 x;                                /* Offset to cell content area */
  u32 iEnd = iStart + iSize;            /* First byte past the iStart buffer */
  unsigned char *data = pPage->aData;   /* Page content */

  assert( pPage->pBt!=0 );
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( CORRUPT_DB || iStart>=pPage->hdrOffset+6+pPage->childPtrSize );
  assert( CORRUPT_DB || iEnd <= pPage->pBt->usableSize );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( iSize>=4 );   /* Minimum cell size is 4 */
  assert( iStart<=pPage->pBt->usableSize-4 );

  /* The list of freeblocks must be in ascending order.  Find the 
  ** spot on the list where iStart should be inserted.
  */
  hdr = pPage->hdrOffset;
  iPtr = hdr + 1;
  if( data[iPtr+1]==0 && data[iPtr]==0 ){
    iFreeBlk = 0;  /* Shortcut for the case when the freelist is empty */
  }else{
    while( (iFreeBlk = get2byte(&data[iPtr]))<iStart ){
      if( iFreeBlk<iPtr+4 ){
        if( iFreeBlk==0 ) break;
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      iPtr = iFreeBlk;
    }
    if( iFreeBlk>pPage->pBt->usableSize-4 ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    assert( iFreeBlk>iPtr || iFreeBlk==0 );
  
    /* At this point:
    **    iFreeBlk:   First freeblock after iStart, or zero if none
    **    iPtr:       The address of a pointer to iFreeBlk
    **
    ** Check to see if iFreeBlk should be coalesced onto the end of iStart.
    */
    if( iFreeBlk && iEnd+3>=iFreeBlk ){
      nFrag = iFreeBlk - iEnd;
      if( iEnd>iFreeBlk ) return SQLITE_CORRUPT_PAGE(pPage);
      iEnd = iFreeBlk + get2byte(&data[iFreeBlk+2]);
      if( iEnd > pPage->pBt->usableSize ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      iSize = iEnd - iStart;
      iFreeBlk = get2byte(&data[iFreeBlk]);
    }
  
    /* If iPtr is another freeblock (that is, if iPtr is not the freelist
    ** pointer in the page header) then check to see if iStart should be
    ** coalesced onto the end of iPtr.
    */
    if( iPtr>hdr+1 ){
      int iPtrEnd = iPtr + get2byte(&data[iPtr+2]);
      if( iPtrEnd+3>=iStart ){
        if( iPtrEnd>iStart ) return SQLITE_CORRUPT_PAGE(pPage);
        nFrag += iStart - iPtrEnd;
        iSize = iEnd - iPtr;
        iStart = iPtr;
      }
    }
    if( nFrag>data[hdr+7] ) return SQLITE_CORRUPT_PAGE(pPage);
    data[hdr+7] -= nFrag;
  }
  x = get2byte(&data[hdr+5]);
  if( iStart<=x ){
    /* The new freeblock is at the beginning of the cell content area,
    ** so just extend the cell content area rather than create another
    ** freelist entry */
    if( iStart<x || iPtr!=hdr+1 ) return SQLITE_CORRUPT_PAGE(pPage);
    put2byte(&data[hdr+1], iFreeBlk);
    put2byte(&data[hdr+5], iEnd);
  }else{
    /* Insert the new freeblock into the freelist */
    put2byte(&data[iPtr], iStart);
  }
  if( pPage->pBt->btsFlags & BTS_FAST_SECURE ){
    /* Overwrite deleted information with zeros when the secure_delete
    ** option is enabled */
    memset(&data[iStart], 0, iSize);
  }
  put2byte(&data[iStart], iFreeBlk);
  put2byte(&data[iStart+2], iSize);
  pPage->nFree += iOrigSize;
  return SQLITE_OK;
}